

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hittable.h
# Opt level: O0

bool __thiscall translate::hit(translate *this,ray *r,interval ray_t,hit_record *rec)

{
  uint uVar1;
  point3 *u;
  vec3 *direction;
  element_type *peVar2;
  bool bVar3;
  double time;
  vec3 local_88;
  undefined1 local_70 [8];
  ray offset_r;
  hit_record *rec_local;
  ray *r_local;
  translate *this_local;
  interval ray_t_local;
  
  offset_r.tm = (double)rec;
  u = ray::origin(r);
  operator-(&local_88,u,&this->offset);
  direction = ray::direction(r);
  ray::time(r,(time_t *)u);
  ray::ray((ray *)local_70,&local_88,direction,time);
  peVar2 = std::__shared_ptr_access<hittable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<hittable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->object);
  uVar1 = (*peVar2->_vptr_hittable[2])(ray_t.min,ray_t.max,peVar2,local_70,offset_r.tm);
  bVar3 = (uVar1 & 1) != 0;
  if (bVar3) {
    vec3::operator+=((vec3 *)offset_r.tm,&this->offset);
  }
  return bVar3;
}

Assistant:

bool hit(const ray& r, interval ray_t, hit_record& rec) const override {
        // Move the ray backwards by the offset
        ray offset_r(r.origin() - offset, r.direction(), r.time());

        // Determine whether an intersection exists along the offset ray (and if so, where)
        if (!object->hit(offset_r, ray_t, rec))
            return false;

        // Move the intersection point forwards by the offset
        rec.p += offset;

        return true;
    }